

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall cmCTestBZR::StatusParser::~StatusParser(StatusParser *this)

{
  StatusParser *this_local;
  
  ~StatusParser(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

StatusParser(cmCTestBZR* bzr, const char* prefix): BZR(bzr)
    {
    this->SetLog(&bzr->Log, prefix);
    this->RegexStatus.compile("^([-+R?XCP ])([NDKM ])([* ]) +(.+)$");
    }